

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HdlcSimulationDataGenerator.cpp
# Opt level: O3

void __thiscall
HdlcSimulationDataGenerator::TransmitBitSync
          (HdlcSimulationDataGenerator *this,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *stream)

{
  pointer puVar1;
  BitState bitState;
  pointer puVar2;
  long lVar3;
  ulong uVar4;
  ulong uVar5;
  uint uVar6;
  ulong uVar7;
  ulong in_R8;
  int iVar8;
  BitState BVar9;
  char cVar10;
  bool bVar11;
  BitExtractor bit_extractor;
  BitExtractor local_50 [12];
  uint local_44;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  ulong local_38;
  
  local_40 = stream;
  CreateFlagBitSeq(this);
  puVar1 = (this->mAbortFramesIndexes).
           super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  lVar3 = (long)(this->mAbortFramesIndexes).
                super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                super__Vector_impl_data._M_finish - (long)puVar1;
  if (lVar3 == 0) {
    in_R8 = 0;
  }
  else {
    uVar5 = 1;
    uVar7 = 0;
    do {
      uVar4 = uVar5;
      bVar11 = puVar1[uVar7] == this->mFrameNumber;
      in_R8 = CONCAT71((int7)(in_R8 >> 8),bVar11);
      if (bVar11) break;
      uVar5 = (ulong)((int)uVar4 + 1);
      uVar7 = uVar4;
    } while (uVar4 < (ulong)(lVar3 >> 2));
  }
  puVar2 = (local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    uVar6 = (int)this + 0x48;
    cVar10 = '\0';
    BVar9 = BIT_LOW;
    uVar5 = 0;
    local_44 = (uint)in_R8;
    do {
      if ((this->mAbortByte == (U32)uVar5 & (byte)in_R8) == 1) {
        iVar8 = 7;
        do {
          SimulationChannelDescriptor::Advance(uVar6);
          iVar8 = iVar8 + -1;
        } while (iVar8 != 0);
        this->mAbortByte = this->mAbortByte + 1;
        return;
      }
      iVar8 = 8;
      local_38 = uVar5;
      BitExtractor::BitExtractor(local_50,(ulong)puVar2[uVar5],LsbFirst,8);
      do {
        bitState = BitExtractor::GetNextBit();
        CreateSyncBit(this,bitState);
        cVar10 = cVar10 + '\x01';
        if (BVar9 != BIT_HIGH || bitState != BIT_HIGH) {
          cVar10 = '\0';
        }
        BVar9 = bitState;
        if (cVar10 == '\x04') {
          SimulationChannelDescriptor::Transition();
          BVar9 = BIT_LOW;
          SimulationChannelDescriptor::Advance(uVar6);
          cVar10 = '\0';
        }
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
      BitExtractor::~BitExtractor(local_50);
      uVar5 = (ulong)((int)local_38 + 1);
      puVar2 = (local_40->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl
               .super__Vector_impl_data._M_start;
      in_R8 = (ulong)local_44;
    } while (uVar5 < (ulong)((long)(local_40->
                                   super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                   )._M_impl.super__Vector_impl_data._M_finish - (long)puVar2));
  }
  CreateFlagBitSeq(this);
  return;
}

Assistant:

void HdlcSimulationDataGenerator::TransmitBitSync( const vector<U8>& stream )
{
    // Opening flag
    CreateFlagBitSeq();

    bool abortFrame = ContainsElement( mFrameNumber );

    U8 consecutiveOnes = 0;
    BitState previousBit = BIT_LOW;
    // For each byte of the stream
    U32 index = 0;
    for( U32 s = 0; s < stream.size(); ++s )
    {
        bool abortThisByte = ( mAbortByte == s );
        if( abortFrame && abortThisByte )
        {
            // Sync bit abort sequence = 7 or more consecutive 1
            for( U32 j = 0; j < 7; ++j )
            {
                CreateSyncBit( BIT_HIGH );
            }
            mAbortByte++;
            return;
        }

        // For each bit of the byte stream
        BitExtractor bit_extractor( stream[ s ], AnalyzerEnums::LsbFirst, 8 );
        for( U32 i = 0; i < 8; ++i )
        {
            BitState bit = bit_extractor.GetNextBit();
            CreateSyncBit( bit );

            if( bit == BIT_HIGH )
            {
                if( previousBit == BIT_HIGH )
                {
                    consecutiveOnes++;
                }
                else
                {
                    consecutiveOnes = 0;
                }
            }
            else // bit low
            {
                consecutiveOnes = 0;
            }

            if( consecutiveOnes == 4 ) // if five 1s in a row, then insert a 0 and continue
            {
                CreateSyncBit( BIT_LOW );
                consecutiveOnes = 0;
                previousBit = BIT_LOW;
            }
            else
            {
                previousBit = bit;
            }
            index++;
        }
    }

    // Closing flag
    CreateFlagBitSeq();
}